

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O3

bool duckdb::ConvertFloatingToBigint<double>(double value,hugeint_t *result)

{
  ulong uVar1;
  OutOfRangeException *this;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double __x;
  string local_40;
  
  if (ABS(value) < 1.7014118346046923e+38 && (ulong)ABS(value) < 0x7ff0000000000000) {
    dVar4 = -value;
    __x = dVar4;
    if (dVar4 <= value) {
      __x = value;
    }
    dVar3 = fmod(__x,1.8446744073709552e+19);
    uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
    result->lower = uVar1;
    uVar2 = (ulong)(__x * 5.421010862427522e-20);
    result->upper = uVar2;
    if (value < dVar4) {
      if (uVar2 == 0x8000000000000000 && uVar1 == 0) {
        this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Negation of HUGEINT is out of range!","");
        OutOfRangeException::OutOfRangeException(this,&local_40);
        __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      result->lower = -uVar1;
      result->upper = ~uVar2 + (ulong)(uVar1 == 0);
    }
  }
  return ABS(value) < 1.7014118346046923e+38 && (ulong)ABS(value) < 0x7ff0000000000000;
}

Assistant:

bool ConvertFloatingToBigint(REAL_T value, hugeint_t &result) {
	if (!Value::IsFinite<REAL_T>(value)) {
		return false;
	}
	if (value <= -170141183460469231731687303715884105728.0 || value >= 170141183460469231731687303715884105727.0) {
		return false;
	}
	bool negative = value < 0;
	if (negative) {
		value = -value;
	}
	result.lower = (uint64_t)fmod(value, REAL_T(NumericLimits<uint64_t>::Maximum()));
	result.upper = (int64_t)(value / REAL_T(NumericLimits<uint64_t>::Maximum()));
	if (negative) {
		Hugeint::NegateInPlace(result);
	}
	return true;
}